

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

int __thiscall BoardView::LoadFile(BoardView *this,path *filepath)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  void *pvVar4;
  path *ppVar5;
  element_type *peVar6;
  PDFBridgeEvince *in_RSI;
  long *in_RDI;
  vector<char,_std::allocator<char>_> *in_stack_000000d8;
  CSTFile *in_stack_000000e0;
  shared_ptr<Pin> *p;
  iterator __end4;
  iterator __begin4;
  SharedVector<Pin> *__range4;
  path conffilepath;
  string *in_stack_00000230;
  path *in_stack_00000238;
  vector<char,_std::allocator<char>_> *in_stack_00000258;
  BDVFile *in_stack_00000260;
  CAEFile *caefile;
  BVRFile *in_stack_00000290;
  FZFile *fzfile;
  vector<char,_std::allocator<char>_> buffer;
  vector<char,_std::allocator<char>_> *in_stack_00000388;
  BVR3File *in_stack_00000390;
  vector<char,_std::allocator<char>_> *in_stack_00000458;
  CADFile *in_stack_00000460;
  vector<char,_std::allocator<char>_> *in_stack_000007f8;
  ADFile *in_stack_00000800;
  vector<char,_std::allocator<char>_> *in_stack_00000a28;
  BRDFile *in_stack_00000a30;
  array<unsigned_int,_44UL> *in_stack_00001030;
  vector<char,_std::allocator<char>_> *in_stack_00001038;
  FZFile *in_stack_00001040;
  vector<char,_std::allocator<char>_> *in_stack_00001288;
  BRD2File *in_stack_00001290;
  path *in_stack_00002638;
  PDFFile *in_stack_00002640;
  path *in_stack_000027a8;
  BackgroundImage *in_stack_000027b0;
  string *in_stack_fffffffffffffcb8;
  BoardView *in_stack_fffffffffffffcc0;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffcc8;
  path *in_stack_fffffffffffffcd0;
  string *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  path *in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  char *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  format in_stack_fffffffffffffd17;
  char (*in_stack_fffffffffffffd18) [5];
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  string *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  bool local_252;
  undefined7 in_stack_fffffffffffffdc8;
  byte in_stack_fffffffffffffdcf;
  PDFBridgeEvince *in_stack_fffffffffffffdd0;
  __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
  local_1d8;
  path *local_1d0;
  path *in_stack_fffffffffffffe40;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  ASCFile *in_stack_fffffffffffffe50;
  path local_1a0;
  string local_178 [32];
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [37];
  byte local_10b;
  byte local_10a;
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [24];
  BRDFileBase *in_stack_ffffffffffffff38;
  BoardView *in_stack_ffffffffffffff40;
  allocator<char> local_b1;
  string local_b0 [32];
  void *local_90;
  allocator<char> local_81;
  string local_80 [72];
  string local_38 [32];
  PDFBridgeEvince *local_18;
  int local_4;
  
  *(undefined1 *)((long)in_RDI + 0xd6b1) = 1;
  *(undefined1 *)((long)in_RDI + 0xd6b2) = 0;
  local_18 = in_RSI;
  bVar1 = std::filesystem::__cxx11::path::empty((path *)0x11ca42);
  if (bVar1) {
    local_4 = 1;
  }
  else {
    if ((*in_RDI != 0) && (in_RDI[1] != 0)) {
      std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::clear
                ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)0x11ca83);
      std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::clear
                ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *
                 )0x11ca97);
      Annotations::Close((Annotations *)in_stack_fffffffffffffcc0);
      (**(code **)(*(long *)in_RDI[1] + 0x10))();
      std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::clear
                ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)0x11cac5);
      (**(code **)(*(long *)in_RDI[1] + 0x20))();
      std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::clear
                ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)0x11cadf);
      (**(code **)(*(long *)in_RDI[1] + 0x18))();
      std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::clear
                ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *
                 )0x11caf9);
      (**(code **)(*(long *)in_RDI[1] + 0x28))();
      std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::clear
                ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)
                 0x11cb13);
      (**(code **)(*(long *)in_RDI[1] + 0x30))();
      std::vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>::clear
                ((vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_> *)
                 0x11cb2d);
    }
    if ((long *)*in_RDI != (long *)0x0) {
      (**(code **)(*(long *)*in_RDI + 8))();
    }
    *in_RDI = 0;
    *(undefined1 *)((long)in_RDI + 0xd6b2) = 0;
    std::__cxx11::string::clear();
    PDFBridgeEvince::CloseDocument((PDFBridgeEvince *)in_stack_fffffffffffffcc0);
    std::filesystem::__cxx11::path::string(in_stack_fffffffffffffce8);
    SetLastFileOpenName(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    std::__cxx11::string::~string(local_38);
    file_as_buffer(in_stack_00000238,in_stack_00000230);
    bVar1 = std::vector<char,_std::allocator<char>_>::empty
                      ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffcd0);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                 in_stack_fffffffffffffcf8,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
      bVar1 = check_fileext((path *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                            in_stack_fffffffffffffd58);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator(&local_81);
      if (bVar1) {
        pvVar4 = operator_new(0x188);
        memset(pvVar4,0,0x188);
        FZFile::FZFile((FZFile *)in_stack_fffffffffffffcc0);
        local_90 = pvVar4;
        FZFile::parse(in_stack_00001040,in_stack_00001038,in_stack_00001030);
        *in_RDI = (long)local_90;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                   in_stack_fffffffffffffcf8,
                   (allocator<char> *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0))
        ;
        in_stack_fffffffffffffdcf =
             check_fileext((path *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                           in_stack_fffffffffffffd58);
        std::__cxx11::string::~string(local_b0);
        std::allocator<char>::~allocator(&local_b1);
        if ((in_stack_fffffffffffffdcf & 1) == 0) {
          std::allocator<char>::allocator();
          local_10a = 0;
          local_10b = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                     in_stack_fffffffffffffcf8,
                     (allocator<char> *)
                     CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
          bVar1 = check_fileext((path *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60
                                                ),in_stack_fffffffffffffd58);
          local_252 = true;
          in_stack_fffffffffffffdd0 = local_18;
          if (!bVar1) {
            std::allocator<char>::allocator();
            local_10a = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                       in_stack_fffffffffffffcf8,
                       (allocator<char> *)
                       CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
            local_10b = 1;
            local_252 = check_fileext((path *)CONCAT17(in_stack_fffffffffffffd67,
                                                       in_stack_fffffffffffffd60),
                                      in_stack_fffffffffffffd58);
            in_stack_fffffffffffffdd0 = local_18;
          }
          if ((local_10b & 1) != 0) {
            std::__cxx11::string::~string(local_108);
          }
          if ((local_10a & 1) != 0) {
            std::allocator<char>::~allocator(&local_109);
          }
          std::__cxx11::string::~string(local_e0);
          std::allocator<char>::~allocator(&local_e1);
          if (local_252 == false) {
            bVar1 = GenCADFile::verifyFormat(in_stack_fffffffffffffd38);
            if (bVar1) {
              pvVar4 = operator_new(0x138);
              GenCADFile::GenCADFile
                        ((GenCADFile *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0)
                         ,(vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffcd8);
              *in_RDI = (long)pvVar4;
            }
            else {
              bVar1 = ADFile::verifyFormat
                                ((vector<char,_std::allocator<char>_> *)
                                 CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
              if (bVar1) {
                pvVar4 = operator_new(0x110);
                ADFile::ADFile(in_stack_00000800,in_stack_000007f8);
                *in_RDI = (long)pvVar4;
              }
              else {
                uVar2 = CADFile::verifyFormat(in_stack_fffffffffffffd38);
                if ((bool)uVar2) {
                  pvVar4 = operator_new(0xc0);
                  CADFile::CADFile(in_stack_00000460,in_stack_00000458);
                  *in_RDI = (long)pvVar4;
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                             in_stack_fffffffffffffcf8,
                             (allocator<char> *)
                             CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
                  bVar3 = check_fileext((path *)CONCAT17(uVar2,in_stack_fffffffffffffd60),
                                        in_stack_fffffffffffffd58);
                  std::__cxx11::string::~string(local_130);
                  std::allocator<char>::~allocator(&local_131);
                  if ((bVar3 & 1) == 0) {
                    bVar1 = BRDFile::verifyFormat
                                      ((vector<char,_std::allocator<char>_> *)
                                       in_stack_fffffffffffffd58);
                    if (bVar1) {
                      pvVar4 = operator_new(0xc0);
                      BRDFile::BRDFile(in_stack_00000a30,in_stack_00000a28);
                      *in_RDI = (long)pvVar4;
                    }
                    else {
                      in_stack_fffffffffffffd27 = BRD2File::verifyFormat(in_stack_fffffffffffffd38);
                      if ((bool)in_stack_fffffffffffffd27) {
                        in_stack_fffffffffffffd18 = (char (*) [5])operator_new(0xc0);
                        BRD2File::BRD2File(in_stack_00001290,in_stack_00001288);
                        *in_RDI = (long)in_stack_fffffffffffffd18;
                      }
                      else {
                        in_stack_fffffffffffffd17 = BDVFile::verifyFormat(in_stack_fffffffffffffd68)
                        ;
                        if ((bool)in_stack_fffffffffffffd17) {
                          pvVar4 = operator_new(0xc0);
                          BDVFile::BDVFile(in_stack_00000260,in_stack_00000258);
                          *in_RDI = (long)pvVar4;
                        }
                        else {
                          uVar2 = BVRFile::verifyFormat
                                            ((vector<char,_std::allocator<char>_> *)
                                             CONCAT17(in_stack_fffffffffffffd07,
                                                      in_stack_fffffffffffffd00));
                          if ((bool)uVar2) {
                            pvVar4 = operator_new(0xc0);
                            BVRFile::BVRFile(in_stack_00000290,
                                             (vector<char,_std::allocator<char>_> *)caefile);
                            *in_RDI = (long)pvVar4;
                          }
                          else {
                            bVar1 = BVR3File::verifyFormat
                                              ((vector<char,_std::allocator<char>_> *)
                                               CONCAT17(uVar2,in_stack_fffffffffffffd00));
                            if (bVar1) {
                              in_stack_fffffffffffffce8 = (path *)operator_new(0xc0);
                              BVR3File::BVR3File(in_stack_00000390,in_stack_00000388);
                              *in_RDI = (long)in_stack_fffffffffffffce8;
                            }
                            else {
                              in_stack_fffffffffffffce7 =
                                   BRDAllegroFile::verifyFormat
                                             ((vector<char,_std::allocator<char>_> *)
                                              CONCAT17(uVar2,in_stack_fffffffffffffd00));
                              if ((bool)in_stack_fffffffffffffce7) {
                                in_stack_fffffffffffffcd8 = (string *)operator_new(0xc0);
                                BRDAllegroFile::BRDAllegroFile
                                          ((BRDAllegroFile *)in_stack_fffffffffffffcd0,
                                           in_stack_fffffffffffffcc8);
                                *in_RDI = (long)in_stack_fffffffffffffcd8;
                              }
                              else {
                                std::__cxx11::string::operator=
                                          ((string *)(in_RDI + 0x1ad7),"Unrecognized file format.");
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    pvVar4 = operator_new(0xe0);
                    CSTFile::CSTFile(in_stack_000000e0,in_stack_000000d8);
                    *in_RDI = (long)pvVar4;
                  }
                }
              }
            }
          }
          else {
            pvVar4 = operator_new(200);
            ASCFile::ASCFile(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                             in_stack_fffffffffffffe40);
            *in_RDI = (long)pvVar4;
          }
        }
        else {
          in_stack_ffffffffffffff40 = (BoardView *)operator_new(0x188);
          memset(in_stack_ffffffffffffff40,0,0x188);
          CAEFile::CAEFile((CAEFile *)in_stack_fffffffffffffcc0);
          FZFile::parse(in_stack_00001040,in_stack_00001038,in_stack_00001030);
          *in_RDI = (long)in_stack_ffffffffffffff40;
          in_stack_fffffffffffffdd0 = local_18;
        }
      }
      if ((*in_RDI != 0) && ((*(byte *)(*in_RDI + 0x90) & 1) != 0)) {
        LoadBoard(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        in_stack_fffffffffffffcd0 = (path *)(in_RDI + 0x52a);
        std::filesystem::__cxx11::path::string(in_stack_fffffffffffffce8);
        FHistory::Prepend_save
                  ((FHistory *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                   in_stack_fffffffffffffcd8);
        std::__cxx11::string::~string(local_158);
        *(undefined4 *)((long)in_RDI + 0xd1bc) = 1;
        *(undefined1 *)(in_RDI + 0x1a38) = 0;
        *(undefined4 *)(in_RDI + 0x1abb) = 0;
        *(undefined4 *)((long)in_RDI + 0xd5dc) = 0;
        EPCCheck((BoardView *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
        ppVar5 = (path *)(in_RDI + 0x1a39);
        std::filesystem::__cxx11::path::string(in_stack_fffffffffffffce8);
        Annotations::SetFilename((Annotations *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8)
        ;
        std::__cxx11::string::~string(local_178);
        Annotations::Load((Annotations *)
                          CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
        std::filesystem::__cxx11::path::path(in_stack_fffffffffffffcd0,ppVar5);
        std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                  ((path *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                   in_stack_fffffffffffffd18,in_stack_fffffffffffffd17);
        std::filesystem::__cxx11::path::replace_extension(&local_1a0);
        std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffcc0);
        BackgroundImage::loadFromConfig(in_stack_000027b0,in_stack_000027a8);
        PDFFile::loadFromConfig(in_stack_00002640,in_stack_00002638);
        PDFBridgeEvince::OpenDocument
                  (in_stack_fffffffffffffdd0,
                   (PDFFile *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
        ppVar5 = (path *)(**(code **)(*(long *)in_RDI[1] + 0x20))();
        local_1d0 = ppVar5;
        local_1d8._M_current =
             (shared_ptr<Pin> *)
             std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::begin
                       ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                        in_stack_fffffffffffffcb8);
        std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::end
                  ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                   in_stack_fffffffffffffcb8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                                   *)ppVar5,
                                  (__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                                   *)in_stack_fffffffffffffcb8), bVar1) {
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
          ::operator*(&local_1d8);
          peVar6 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                              0x11da67);
          peVar6->diameter = 7.0;
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
          ::operator++(&local_1d8);
        }
        CenterView((BoardView *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
        *(undefined1 *)((long)in_RDI + 0xd6b1) = 0;
        *(undefined1 *)((long)in_RDI + 0xd6b2) = 1;
        std::__cxx11::string::clear();
        std::filesystem::__cxx11::path::~path(ppVar5);
      }
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffcd0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int BoardView::LoadFile(const filesystem::path &filepath) {
	m_lastFileOpenWasInvalid = true;
	m_validBoard             = false;
	if (!filepath.empty()) {
		// clean up the previous file.
		if (m_file && m_board) {
			m_pinHighlighted.clear();
			m_partHighlighted.clear();
			m_annotations.Close();
			m_board->Nets().clear();
			m_board->Pins().clear();
			m_board->Components().clear();
			m_board->OutlinePoints().clear();
			m_board->OutlineSegments().clear();
			//	delete m_file;
			// delete m_board;
		}
		delete m_file;
		m_file = nullptr;
		m_validBoard = false;
		m_error_msg.clear();
		pdfBridge.CloseDocument();

		SetLastFileOpenName(filepath.string());
		std::vector<char> buffer = file_as_buffer(filepath, m_error_msg);
		if (!buffer.empty()) {
			if (check_fileext(filepath, ".fz")) { // Since it is encrypted we cannot use the below logic. Trust the ext.
				FZFile *fzfile = new FZFile();
				fzfile->parse(buffer, config.FZKey);
				m_file = fzfile;
			} else if (check_fileext(filepath, ".cae")) { // Since it is encrypted we cannot use the below logic. Trust the ext.
				CAEFile *caefile = new CAEFile();
				caefile->parse(buffer, config.CAEKey);
				m_file = caefile;
			} else if (check_fileext(filepath, ".bom") || check_fileext(filepath, ".asc"))
				m_file = new ASCFile(buffer, filepath);
			else if (GenCADFile::verifyFormat(buffer))
				m_file = new GenCADFile(buffer);
			else if (ADFile::verifyFormat(buffer))
				m_file = new ADFile(buffer);
			else if (CADFile::verifyFormat(buffer))
				m_file = new CADFile(buffer);
			else if (check_fileext(filepath, ".cst"))
				m_file = new CSTFile(buffer);
			else if (BRDFile::verifyFormat(buffer))
				m_file = new BRDFile(buffer);
			else if (BRD2File::verifyFormat(buffer))
				m_file = new BRD2File(buffer);
			else if (BDVFile::verifyFormat(buffer))
				m_file = new BDVFile(buffer);
			else if (BVRFile::verifyFormat(buffer))
				m_file = new BVRFile(buffer);
			else if (BVR3File::verifyFormat(buffer))
				m_file = new BVR3File(buffer);
			else if (BRDAllegroFile::verifyFormat(buffer))
				m_file = new BRDAllegroFile(buffer);
			else
				m_error_msg = "Unrecognized file format.";

			if (m_file && m_file->valid) {
				LoadBoard(m_file);
				fhistory.Prepend_save(filepath.string());
				history_file_has_changed = 1; // used by main to know when to update the window title
				boardMinMaxDone          = false;
				m_rotation               = 0;
				m_current_side           = 0;
				EPCCheck(); // check to see we don't have a flipped board outline

				m_annotations.SetFilename(filepath.string());
				m_annotations.Load();

				auto conffilepath = filepath;
				conffilepath.replace_extension("conf");
				backgroundImage.loadFromConfig(conffilepath);
				pdfFile.loadFromConfig(conffilepath);

				pdfBridge.OpenDocument(pdfFile);

				/*
				 * Set pins to a known lower size, they get resized
				 * in DrawParts() when the component is analysed
				 */
				for (auto &p : m_board->Pins()) {
					//					auto p      = pin.get();
					p->diameter = 7;
				}

				CenterView();
				m_lastFileOpenWasInvalid = false;
				m_validBoard             = true;
				m_error_msg.clear();
			}
		}
	} else {
		return 1;
	}

	return 0;
}